

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ConfigLiblistSyntax * __thiscall slang::parsing::Parser::parseConfigLiblist(Parser *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ConfigLiblistSyntax *pCVar3;
  EVP_PKEY_CTX *src;
  Token liblist;
  EVP_PKEY_CTX *local_c8;
  Token local_c0;
  SyntaxNode *local_b0;
  SyntaxNode *pSStack_a8;
  pointer local_98;
  SmallVector<slang::parsing::Token,_4UL> tokens;
  
  liblist = ParserBase::expect(&this->super_ParserBase,LibListKeyword);
  tokens.super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)tokens.super_SmallVectorBase<slang::parsing::Token>.firstElement;
  tokens.super_SmallVectorBase<slang::parsing::Token>.len = 0;
  tokens.super_SmallVectorBase<slang::parsing::Token>.cap = 4;
  while( true ) {
    local_c8 = liblist._0_8_;
    bVar1 = ParserBase::peek(&this->super_ParserBase,Identifier);
    if (!bVar1) break;
    local_c0 = ParserBase::consume(&this->super_ParserBase);
    SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
              (&tokens.super_SmallVectorBase<slang::parsing::Token>,&local_c0);
    bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
    if (bVar1) {
      ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x100850005);
    }
  }
  iVar2 = SmallVectorBase<slang::parsing::Token>::copy
                    (&tokens.super_SmallVectorBase<slang::parsing::Token>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_98 = (pointer)CONCAT44(extraout_var,iVar2);
  local_c0.info._0_4_ = 2;
  local_b0 = (SyntaxNode *)0x0;
  pSStack_a8 = (SyntaxNode *)0x0;
  local_c0._0_8_ = &PTR_getChild_005e7cf0;
  pCVar3 = slang::syntax::SyntaxFactory::configLiblist
                     (&this->factory,liblist,(TokenList *)&local_c0);
  SmallVectorBase<slang::parsing::Token>::cleanup
            (&tokens.super_SmallVectorBase<slang::parsing::Token>,local_c8);
  return pCVar3;
}

Assistant:

ConfigLiblistSyntax& Parser::parseConfigLiblist() {
    auto liblist = expect(TokenKind::LibListKeyword);

    SmallVector<Token, 4> tokens;
    while (peek(TokenKind::Identifier)) {
        tokens.push_back(consume());
        if (peek(TokenKind::Comma))
            skipToken(diag::NoCommaInList);
    }

    return factory.configLiblist(liblist, tokens.copy(alloc));
}